

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O3

int32_t icu_63::RelativeDateFormat::dayDifference(Calendar *cal,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  UDate millis;
  Calendar *this;
  
  iVar2 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = (*(cal->super_UObject)._vptr_UObject[3])();
    this = (Calendar *)CONCAT44(extraout_var,iVar1);
    millis = Calendar::getNow();
    Calendar::setTimeInMillis(this,millis,status);
    iVar2 = Calendar::get(cal,UCAL_JULIAN_DAY,status);
    iVar3 = Calendar::get(this,UCAL_JULIAN_DAY,status);
    iVar2 = iVar2 - iVar3;
    (*(this->super_UObject)._vptr_UObject[1])(this);
  }
  return iVar2;
}

Assistant:

int32_t RelativeDateFormat::dayDifference(Calendar &cal, UErrorCode &status) {
    if(U_FAILURE(status)) {
        return 0;
    }
    // TODO: Cache the nowCal to avoid heap allocs? Would be difficult, don't know the calendar type
    Calendar *nowCal = cal.clone();
    nowCal->setTime(Calendar::getNow(), status);

    // For the day difference, we are interested in the difference in the (modified) julian day number
    // which is midnight to midnight.  Using fieldDifference() is NOT correct here, because 
    // 6pm Jan 4th  to 10am Jan 5th should be considered "tomorrow".
    int32_t dayDiff = cal.get(UCAL_JULIAN_DAY, status) - nowCal->get(UCAL_JULIAN_DAY, status);

    delete nowCal;
    return dayDiff;
}